

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O2

void arrangeQuoters_superFast_iVar5
               (uint *pInOut,uint *temp,int start,int iQ,int jQ,int kQ,int lQ,char *pCanonPerm,
               uint *pCanonPhase)

{
  uint uVar1;
  uint *puVar2;
  
  if (jQ == 1 && iQ == 0) {
    return;
  }
  puVar2 = temp + (long)start + -1;
  for (uVar1 = start - 1; 0 < (int)uVar1; uVar1 = uVar1 - 4) {
    *puVar2 = pInOut[(ulong)uVar1 - (long)iQ];
    puVar2[-1] = pInOut[(ulong)uVar1 - (long)jQ];
    puVar2[-2] = pInOut[(ulong)uVar1 - (long)kQ];
    puVar2[-3] = pInOut[(ulong)uVar1 - (long)lQ];
    puVar2 = puVar2 + -4;
  }
  memcpy(pInOut,temp,(long)start << 2);
  updataInfo(iQ,jQ,5,pCanonPerm,pCanonPhase);
  return;
}

Assistant:

void arrangeQuoters_superFast_iVar5(unsigned* pInOut, unsigned* temp, int start,  int iQ, int jQ, int kQ, int lQ, char * pCanonPerm, unsigned* pCanonPhase)
{
    int i,blockSize,shiftSize;
    unsigned* tempPtr = temp+start;
//     printf("in arrangeQuoters_superFast_iVar5\n");

    if(iQ == 0 && jQ == 1)
        return; 
    blockSize = sizeof(unsigned);
    shiftSize = 4;
    for(i=start-1;i>0;i-=shiftSize)
    {       
        tempPtr -= 1;       
        memcpy(tempPtr, pInOut+i-iQ, blockSize);
        tempPtr -= 1;
        memcpy(tempPtr, pInOut+i-jQ, blockSize);
        tempPtr -= 1;
        memcpy(tempPtr, pInOut+i-kQ, blockSize);
        tempPtr -= 1;
        memcpy(tempPtr, pInOut+i-lQ, blockSize);        
    }   
    memcpy(pInOut, temp, start*sizeof(unsigned));
    updataInfo(iQ, jQ, 5, pCanonPerm, pCanonPhase);
}